

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int parseHhMmSs(char *zDate,DateTime *p)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  byte *pbVar7;
  byte *zDate_00;
  long in_FS_OFFSET;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  int s;
  int m;
  int h;
  int local_30;
  int local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  h = -0x55555556;
  m = -0x55555556;
  s = -0x55555556;
  iVar3 = getDigits(zDate,"20c:20e");
  uVar6 = 1;
  if (iVar3 != 2) goto LAB_001a0d1e;
  if (zDate[5] == ':') {
    iVar3 = getDigits(zDate + 6,"20e",&s);
    if (iVar3 != 1) goto LAB_001a0d1e;
    zDate_00 = (byte *)(zDate + 8);
    dVar11 = 0.0;
    if ((zDate[8] == '.') && (uVar5 = (ulong)(byte)zDate[9], 0xfffffffffffffff5 < uVar5 - 0x3a)) {
      zDate_00 = (byte *)(zDate + 9);
      dVar10 = 1.0;
      dVar9 = 0.0;
      while (0xfffffffffffffff5 < uVar5 - 0x3a) {
        dVar9 = dVar9 * 10.0 + (double)(int)(char)uVar5 + -48.0;
        dVar10 = dVar10 * 10.0;
        pbVar7 = zDate_00 + 1;
        zDate_00 = zDate_00 + 1;
        uVar5 = (ulong)*pbVar7;
      }
      dVar11 = 0.999;
      if (dVar9 / dVar10 <= 0.999) {
        dVar11 = dVar9 / dVar10;
      }
    }
  }
  else {
    s = 0;
    zDate_00 = (byte *)(zDate + 5);
    dVar11 = 0.0;
  }
  p->validJD = '\0';
  bVar1 = p->field_0x2c;
  p->field_0x2c = bVar1 & 0xfe;
  p->validHMS = '\x01';
  p->h = h;
  p->m = m;
  p->s = (double)s + dVar11;
  do {
    pbVar7 = zDate_00;
    zDate_00 = pbVar7 + 1;
  } while ((""[*pbVar7] & 1) != 0);
  local_2c = -0x55555556;
  local_30 = -0x55555556;
  p->tz = 0;
  bVar2 = *pbVar7;
  if (bVar2 == 0x2d) {
    iVar3 = -1;
LAB_001a0cbb:
    iVar4 = getDigits((char *)zDate_00,"20b:20e",&local_2c,&local_30);
    bVar8 = true;
    if (iVar4 == 2) {
      zDate_00 = pbVar7 + 6;
      p->tz = (local_2c * 0x3c + local_30) * iVar3;
LAB_001a0d04:
      do {
        bVar2 = *zDate_00;
        zDate_00 = zDate_00 + 1;
      } while ((""[bVar2] & 1) != 0);
      goto LAB_001a0d18;
    }
  }
  else {
    if (bVar2 == 0x2b) {
      iVar3 = 1;
      goto LAB_001a0cbb;
    }
    if ((bVar2 & 0xdf) == 0x5a) {
      p->field_0x2c = bVar1 & 0xe6 | 8;
      goto LAB_001a0d04;
    }
LAB_001a0d18:
    bVar8 = bVar2 != 0;
  }
  uVar6 = (uint)bVar8;
LAB_001a0d1e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return uVar6;
}

Assistant:

static int parseHhMmSs(const char *zDate, DateTime *p){
  int h, m, s;
  double ms = 0.0;
  if( getDigits(zDate, "20c:20e", &h, &m)!=2 ){
    return 1;
  }
  zDate += 5;
  if( *zDate==':' ){
    zDate++;
    if( getDigits(zDate, "20e", &s)!=1 ){
      return 1;
    }
    zDate += 2;
    if( *zDate=='.' && sqlite3Isdigit(zDate[1]) ){
      double rScale = 1.0;
      zDate++;
      while( sqlite3Isdigit(*zDate) ){
        ms = ms*10.0 + *zDate - '0';
        rScale *= 10.0;
        zDate++;
      }
      ms /= rScale;
      /* Truncate to avoid problems with sub-milliseconds
      ** rounding. https://sqlite.org/forum/forumpost/766a2c9231 */
      if( ms>0.999 ) ms = 0.999;
    }
  }else{
    s = 0;
  }
  p->validJD = 0;
  p->rawS = 0;
  p->validHMS = 1;
  p->h = h;
  p->m = m;
  p->s = s + ms;
  if( parseTimezone(zDate, p) ) return 1;
  return 0;
}